

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_graph_pipeline.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  FlowBuilder *this;
  Task *pTVar1;
  undefined1 *__stat_loc;
  Task stop;
  Task task;
  Task init;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>_>
  pl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodes;
  size_t num_lines;
  Executor executor;
  Taskflow taskflow;
  string *in_stack_fffffffffffff9b8;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>_>
  *in_stack_fffffffffffff9c0;
  Executor *in_stack_fffffffffffff9c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9d0;
  string *in_stack_fffffffffffff9d8;
  Taskflow *in_stack_fffffffffffff9e0;
  allocator_type *in_stack_fffffffffffff9e8;
  allocator<char> *in_stack_fffffffffffff9f0;
  Executor *this_00;
  iterator in_stack_fffffffffffff9f8;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>_>
  *in_stack_fffffffffffffa00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  FlowBuilder *in_stack_fffffffffffffa08;
  string *local_5d8;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>
  *ps_2;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>
  *ps_1;
  element_type *in_stack_fffffffffffffa80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffa88;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>_>
  *in_stack_fffffffffffffa90;
  allocator<char> local_559;
  undefined8 in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  Task local_528;
  undefined1 local_519 [41];
  Task local_4f0;
  allocator<char> local_4e1;
  string local_4e0 [48];
  Task local_4b0;
  anon_class_8_1_a85c01d1_for__callable local_4a8;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>
  local_4a0;
  anon_class_8_1_a85c01d1_for__callable local_490;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>
  local_488;
  anon_class_8_1_a85c01d1_for__callable local_478;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>
  local_470 [24];
  undefined1 local_2ec;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  string *local_2e8;
  string local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  string *local_280;
  undefined8 local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  undefined8 local_258;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>
  local_250;
  undefined1 local_240 [335];
  undefined1 local_f1 [237];
  int local_4;
  
  local_4 = 0;
  ps_1 = (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>
          *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  std::thread::hardware_concurrency();
  ps_2 = &local_250;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffaa8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1059da);
  local_258 = 2;
  local_2ec = 1;
  local_2e8 = local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  local_2e8 = (string *)local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  local_2e8 = (string *)local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  local_2ec = 0;
  local_280 = local_2e0;
  local_278 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x105b05);
  __l._M_len = (size_type)in_stack_fffffffffffffa00;
  __l._M_array = in_stack_fffffffffffff9f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff9f0,__l,in_stack_fffffffffffff9e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x105b36);
  local_5d8 = (string *)&local_280;
  do {
    local_5d8 = local_5d8 + -0x20;
    std::__cxx11::string::~string(local_5d8);
  } while (local_5d8 != local_2e0);
  std::allocator<char>::~allocator(&local_2eb);
  std::allocator<char>::~allocator(&local_2ea);
  std::allocator<char>::~allocator(&local_2e9);
  local_478.nodes = &local_270;
  tf::
  Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:40:36)>
  ::Pipe(local_470,SERIAL,&local_478);
  local_490.nodes = &local_270;
  tf::
  Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:50:36)>
  ::Pipe(&local_488,SERIAL,&local_490);
  local_4a8.nodes = &local_270;
  tf::
  Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:55:36)>
  ::Pipe(&local_4a0,SERIAL,&local_4a8);
  tf::
  Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:40:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:50:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:55:36)>_>
  ::Pipeline(in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88._M_pi,
             (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>
              *)in_stack_fffffffffffffa80,ps_1,ps_2);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:61:36),_nullptr>
            (in_stack_fffffffffffffa08,(anon_class_1_0_00000001 *)in_stack_fffffffffffffa00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  this = (FlowBuilder *)tf::Task::name((Task *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  tf::Task::Task(&local_4b0,(Task *)this);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  tf::FlowBuilder::
  composed_of<tf::Pipeline<tf::Pipe<main::__0>,tf::Pipe<main::__1>,tf::Pipe<main::__2>>>
            (this,in_stack_fffffffffffffa00);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_519;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  pTVar1 = tf::Task::name((Task *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  tf::Task::Task(&local_4f0,pTVar1);
  std::__cxx11::string::~string((string *)(local_519 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_519);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:65:36),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_01);
  this_00 = (Executor *)&local_559;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)pTVar1,(allocator<char> *)this_00);
  pTVar1 = tf::Task::name((Task *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  tf::Task::Task(&local_528,pTVar1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa8);
  std::allocator<char>::~allocator(&local_559);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff9c0,(Task *)in_stack_fffffffffffff9b8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff9c0,(Task *)in_stack_fffffffffffff9b8);
  tf::Taskflow::dump((Taskflow *)in_stack_fffffffffffff9c0,(ostream *)in_stack_fffffffffffff9b8);
  __stat_loc = local_240;
  tf::Executor::run(in_stack_fffffffffffff9c8,(Taskflow *)in_stack_fffffffffffff9c0);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffa80,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff9c0);
  local_4 = 0;
  tf::
  Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:40:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:50:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:55:36)>_>
  ::~Pipeline(in_stack_fffffffffffff9c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffff9d0);
  tf::Executor::~Executor(this_00);
  tf::Taskflow::~Taskflow((Taskflow *)in_stack_fffffffffffff9c0);
  return local_4;
}

Assistant:

int main() {

  tf::Taskflow taskflow("graph processing pipeline");
  tf::Executor executor;

  const size_t num_lines = 2;

  // a topological order of the graph
  //    |-> B
  // A--|
  //    |-> C
  const std::vector<std::string> nodes = {"A", "B", "C"};

  // the pipeline consists of three serial pipes
  // and up to two concurrent scheduling tokens
  tf::Pipeline pl(num_lines,

    // first pipe calls f1
    tf::Pipe{tf::PipeType::SERIAL, [&](tf::Pipeflow& pf) {
      if(pf.token() == nodes.size()) {
        pf.stop();
      }
      else {
        f1(nodes[pf.token()]);
      }
    }},

    // second pipe calls f2
    tf::Pipe{tf::PipeType::SERIAL, [&](tf::Pipeflow& pf) {
      f2(nodes[pf.token()]);
    }},

    // third pipe calls f3
    tf::Pipe{tf::PipeType::SERIAL, [&](tf::Pipeflow& pf) {
      f3(nodes[pf.token()]);
    }}
  );

  // build the pipeline graph using composition
  tf::Task init = taskflow.emplace([](){ std::cout << "ready\n"; })
                          .name("starting pipeline");
  tf::Task task = taskflow.composed_of(pl)
                          .name("pipeline");
  tf::Task stop = taskflow.emplace([](){ std::cout << "stopped\n"; })
                          .name("pipeline stopped");

  // create task dependency
  init.precede(task);
  task.precede(stop);

  // dump the pipeline graph structure (with composition)
  taskflow.dump(std::cout);

  // run the pipeline
  executor.run(taskflow).wait();

  return 0;
}